

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.cpp
# Opt level: O2

void FLog::mWarning(time_t dateTime,int line,string *function,string *file,string *text)

{
  id __id;
  char *pcVar1;
  ostream *poVar2;
  time_t dateTime_local;
  string timeTemp;
  string temp;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string threadIdStr;
  mutex locker;
  ostringstream sstream;
  
  dateTime_local = dateTime;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&sstream);
  __id._M_thread = pthread_self();
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&sstream,__id);
  std::__cxx11::stringbuf::str();
  if ((int)logLevel < 2) {
    if (printAll != false || printWarning != false) {
      pcVar1 = ctime(&dateTime_local);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&timeTemp,pcVar1,(allocator<char> *)&locker);
      std::__cxx11::string::replace((ulong)&timeTemp,timeTemp._M_string_length - 1,(char *)0x1);
      std::operator+(&local_468," [DateTime: ",&timeTemp);
      std::operator+(&local_448,&local_468," ] ");
      std::operator+(&local_428,&local_448," [Type: Warning ] ");
      std::operator+(&local_408,&local_428," [Line: ");
      std::__cxx11::to_string(&local_488,line);
      std::operator+(&local_3e8,&local_408,&local_488);
      std::operator+(&local_3c8,&local_3e8," ] ");
      std::operator+(&local_3a8,&local_3c8," [Function: ");
      std::operator+(&local_388,&local_3a8,function);
      std::operator+(&local_368,&local_388," ] ");
      std::operator+(&local_348,&local_368," [Thread Id: ");
      std::operator+(&local_328,&local_348,&threadIdStr);
      std::operator+(&local_308,&local_328," ] ");
      std::operator+(&local_2e8,&local_308," [File: ");
      std::operator+(&local_2c8,&local_2e8,file);
      std::operator+(&local_2a8,&local_2c8," ] ");
      std::operator+(&local_288,&local_2a8," [MSG: ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locker,
                     &local_288,text);
      std::operator+(&temp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &locker," ] ");
      std::__cxx11::string::~string((string *)&locker);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_468);
      locker.super___mutex_base._M_mutex._16_8_ = 0;
      locker.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
      locker.super___mutex_base._M_mutex.__align = 0;
      locker.super___mutex_base._M_mutex._8_8_ = 0;
      locker.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
      std::mutex::lock(&locker);
      poVar2 = std::operator<<((ostream *)&std::clog,(string *)&temp);
      std::endl<char,std::char_traits<char>>(poVar2);
      pthread_mutex_unlock((pthread_mutex_t *)&locker);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::string::~string((string *)&timeTemp);
    }
    pcVar1 = ctime(&dateTime_local);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,pcVar1,(allocator<char> *)&timeTemp);
    std::__cxx11::to_string(&local_4c8,line);
    std::__cxx11::string::string((string *)&local_4e8,(string *)file);
    std::__cxx11::string::string((string *)&local_508,(string *)text);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"warning",(allocator<char> *)&temp);
    FONQRI::Log::Log((Log *)&locker,&local_4a8,&local_4c8,&local_4e8,&local_508,&local_528);
    std::vector<FONQRI::Log,_std::allocator<FONQRI::Log>_>::emplace_back<FONQRI::Log>
              (&normalLogList,(Log *)&locker);
    FONQRI::Log::~Log((Log *)&locker);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4a8);
  }
  std::__cxx11::string::~string((string *)&threadIdStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sstream);
  return;
}

Assistant:

void FLog::mWarning(const time_t dateTime, int line, std::string function,
			std::string file, std::string text)
{

	// get thread id and convert it to string
	std::ostringstream sstream;
	sstream << std::this_thread::get_id();
	std::string threadIdStr = sstream.str();

	if (logLevel < FLog::important) {
		if (FLog::printWarning | FLog::printAll) {
			std::string timeTemp = std::string(std::ctime(&dateTime));
			timeTemp.replace(timeTemp.size() - 1, 1, "");
			std::string temp = " [DateTime: " + timeTemp + " ] " +
					   " [Type: Warning ] " + " [Line: " +
					   std::to_string(line) + " ] " +
					   " [Function: " + function + " ] " +
					   " [Thread Id: " + threadIdStr + " ] " +
					   " [File: " + file + " ] " + " [MSG: " +
					   text + " ] ";
			std::mutex locker;
			locker.lock();
			std::clog << temp << std::endl;
			locker.unlock();
		}
		FLog::normalLogList.push_back(
		FONQRI::Log(std::string(std::ctime(&dateTime)),
				std::to_string(line), file, text, "warning"));

		if (FLog::normalLogList.size() >= FLog::logCounts) {
			// NOTE you can save save normalLogList  to database
		}
	}
}